

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall polyscope::SlicePlane::setSliceAttributes(SlicePlane *this,ShaderProgram *p)

{
  pointer pcVar1;
  pointer paVar2;
  VolumeMesh *pVVar3;
  pointer paVar4;
  array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *paVar5;
  long lVar6;
  size_type __new_size;
  long lVar7;
  undefined1 *indices;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  ManagedBufferRegistry *local_d0 [2];
  undefined1 local_c0 [32];
  undefined1 local_a0 [16];
  element_type *local_90 [2];
  undefined1 local_80 [16];
  element_type *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pcVar1 = (this->inspectedMeshName)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->inspectedMeshName)._M_string_length);
  pVVar3 = getVolumeMesh(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  paVar4 = (pVVar3->cells).
           super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (pVVar3->cells).
           super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __new_size = (long)paVar2 - (long)paVar4 >> 5;
  lVar7 = 0;
  do {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(this->sliceBufferDataArr)._M_elems[0].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7),__new_size);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x60);
  if (paVar2 != paVar4) {
    paVar4 = (pVVar3->cells).
             super__Vector_base<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      lVar6 = 0;
      paVar5 = &this->sliceBufferDataArr;
      do {
        paVar5->_M_elems[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = paVar4->_M_elems[lVar6];
        lVar6 = lVar6 + 1;
        paVar5 = (array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
                 (paVar5->_M_elems + 1);
      } while (lVar6 != 4);
      lVar7 = lVar7 + 1;
      paVar4 = paVar4 + 1;
    } while (lVar7 != __new_size + (__new_size == 0));
  }
  lVar7 = 0;
  do {
    render::ManagedBuffer<unsigned_int>::markHostBufferUpdated
              ((ManagedBuffer<unsigned_int> *)
               (&((array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *)
                 (&this->sliceBufferDataArr + 1))->field_0x0 + lVar7));
    lVar7 = lVar7 + 0xe8;
  } while (lVar7 != 0x3a0);
  local_70[0] = (element_type *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"a_slice_1","");
  indices = &(pVVar3->super_QuantityStructure<polyscope::VolumeMesh>).field_0x428;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_e8 + 8),
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_70,local_e8 + 8);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_70[0] != (element_type *)local_60) {
    operator_delete(local_70[0]);
  }
  local_90[0] = (element_type *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_slice_2","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)(local_f8._M_local_buf + 8),
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_90,local_f8._M_local_buf + 8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_);
  }
  if (local_90[0] != (element_type *)local_80) {
    operator_delete(local_90[0]);
  }
  local_c0._16_8_ = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"a_slice_3","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_100,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_c0 + 0x10,local_100);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_allocated_capacity);
  }
  if ((undefined1 *)local_c0._16_8_ != local_a0) {
    operator_delete((void *)local_c0._16_8_);
  }
  local_d0[0] = (ManagedBufferRegistry *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a_slice_4","");
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getIndexedRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_110,
             (ManagedBuffer<unsigned_int> *)indices);
  (*p->_vptr_ShaderProgram[0x13])(p,local_d0,local_110);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_p);
  }
  if (local_d0[0] != (ManagedBufferRegistry *)local_c0) {
    operator_delete(local_d0[0]);
  }
  return;
}

Assistant:

void SlicePlane::setSliceAttributes(render::ShaderProgram& p) {
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);


  size_t cellCount = meshToInspect->nCells();
  for (int i = 0; i < 4; i++) {
    sliceBufferDataArr[i].resize(cellCount);
  }
  for (size_t iC = 0; iC < cellCount; iC++) {
    const std::array<uint32_t, 8>& cell = meshToInspect->cells[iC];
    for (int i = 0; i < 4; i++) {
      sliceBufferDataArr[i][iC] = cell[i];
    }
  }

  for (int i = 0; i < 4; i++) {
    sliceBufferArr[i].markHostBufferUpdated();
  }

  p.setAttribute("a_slice_1", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[0]));
  p.setAttribute("a_slice_2", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[1]));
  p.setAttribute("a_slice_3", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[2]));
  p.setAttribute("a_slice_4", meshToInspect->vertexPositions.getIndexedRenderAttributeBuffer(sliceBufferArr[3]));
}